

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

double __thiscall
imrt::EvaluationFunction::incremental_eval
          (EvaluationFunction *this,Station *station,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  Matrix *pMVar5;
  _List_node_base *p_Var6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_88;
  value_type local_58;
  double local_48;
  undefined8 uStack_40;
  
  this->prev_F = this->F;
  std::__cxx11::
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::clear(&this->Z_diff);
  uVar7 = 0;
  local_88 = 0.0;
  do {
    if ((long)this->nb_organs <= (long)uVar7) {
      local_88 = local_88 + this->F;
      this->F = local_88;
      n_evaluations = n_evaluations + 1;
      return local_88;
    }
    pMVar5 = Station::getDepositionMatrix(station,(int)uVar7);
    for (lVar8 = 0;
        iVar3 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7], lVar8 < iVar3; lVar8 = lVar8 + 1) {
      dVar13 = 0.0;
      p_Var6 = (_List_node_base *)diff;
      while( true ) {
        p_Var6 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var6 == (_List_node_base *)diff) break;
        uVar9 = -(ulong)(pMVar5->p[lVar8][*(int *)&p_Var6[1]._M_next] == 0.0);
        dVar13 = (double)(uVar9 & (ulong)dVar13 |
                         ~uVar9 & (ulong)((double)p_Var6[1]._M_prev *
                                          pMVar5->p[lVar8][*(int *)&p_Var6[1]._M_next] + dVar13));
      }
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        lVar4 = *(long *)&(this->Z).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        dVar11 = *(double *)(lVar4 + lVar8 * 8);
        dVar1 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        dVar10 = dVar13 + dVar11;
        if (dVar1 <= dVar11) {
          dVar12 = 0.0;
          if (dVar10 < dVar1) {
            dVar12 = (dVar1 - dVar10) * (dVar1 - dVar10) *
                     (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar7] + 0.0;
          }
        }
        else {
          dVar12 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
          if (dVar1 <= dVar10) {
            dVar12 = 0.0 - dVar12 * (dVar1 - dVar11) * (dVar1 - dVar11);
          }
          else {
            dVar12 = ((dVar11 - dVar1) + (dVar11 - dVar1) + dVar13) * dVar12 * dVar13 + 0.0;
          }
        }
        dVar1 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        uStack_40 = 0;
        if (dVar11 <= dVar1) {
          if (dVar1 < dVar10) {
            dVar11 = (dVar10 - dVar1) * (dVar10 - dVar1) *
                     (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
            goto LAB_00123cfe;
          }
        }
        else {
          dVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar7];
          dVar11 = dVar11 - dVar1;
          if (dVar10 <= dVar1) {
            dVar12 = dVar12 - dVar2 * dVar11 * dVar11;
          }
          else {
            dVar11 = (dVar11 + dVar11 + dVar13) * dVar2 * dVar13;
LAB_00123cfe:
            dVar12 = dVar12 + dVar11;
          }
        }
        local_88 = local_88 + dVar12 / (double)iVar3;
        *(double *)(lVar4 + lVar8 * 8) = dVar10;
        local_48 = dVar13;
        update_sorted_voxels(this,w,Zmin,Zmax,(int)uVar7,(int)lVar8);
        local_58.first = (pair<int,_int>)(lVar8 << 0x20 | uVar7);
        local_58.second = local_48;
        std::__cxx11::
        list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
        ::push_back(&this->Z_diff,&local_58);
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

double EvaluationFunction::incremental_eval(Station& station, vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax, list< pair< int, double > >& diff){

  prev_F=F; Z_diff.clear();
  double delta_F=0.0;

  //for each voxel we compute the change produced by the modified beamlets
  //while at the same time we compute the variation in the function F produced by all these changes

  for(int o=0; o<nb_organs; o++){
		const Matrix&  Dep = station.getDepositionMatrix(o);
		for(int k=0; k<nb_voxels[o]; k++){

		//we compute the change in the delivered dose in voxel k of the organ o
		double delta=0.0;

		//cout << station.changed_lets.size() << endl;
		for (auto let:diff){
		    int b=let.first;
			  if(Dep(k,b)==0.0) continue;
				delta+= Dep(k,b)*let.second;
		}


		if(delta==0.0) continue; //no change in the voxel


		double pen=0.0;
		//with the change in the dose of a voxel we can incrementally modify the value of F
		if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
			pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
		else if(Z[o][k] < Zmin[o]) //the penalty disappears
			pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
		else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
			pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );

		if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
			pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
		else if(Z[o][k] > Zmax[o]) //the penalty disappears
			pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
		else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
			pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );

		delta_F += pen/nb_voxels[o];
		Z[o][k] += delta;

    double prev_Dok=D[o][k];
		update_sorted_voxels(w, Zmin, Zmax, o, k);
		//update_beamlets_impact(o, k, prev_Dok);

		//we save the last changes (see undo_last_eval)
		Z_diff.push_back(make_pair(make_pair(o,k),delta));
	}
  }

  F+=delta_F;
  n_evaluations++;
  return F;

}